

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O3

void dump_objects(ang_file *fff)

{
  char *pcVar1;
  angband_constants *paVar2;
  long lVar3;
  ulong uVar4;
  object_kind *poVar5;
  char name [120];
  char local_a8 [120];
  
  file_putf(fff,"# Objects\n");
  if (z_info->k_max != 0) {
    lVar3 = 9;
    uVar4 = 0;
    paVar2 = z_info;
    poVar5 = k_info;
    do {
      local_a8[0x60] = '\0';
      local_a8[0x61] = '\0';
      local_a8[0x62] = '\0';
      local_a8[99] = '\0';
      local_a8[100] = '\0';
      local_a8[0x65] = '\0';
      local_a8[0x66] = '\0';
      local_a8[0x67] = '\0';
      local_a8[0x68] = '\0';
      local_a8[0x69] = '\0';
      local_a8[0x6a] = '\0';
      local_a8[0x6b] = '\0';
      local_a8[0x6c] = '\0';
      local_a8[0x6d] = '\0';
      local_a8[0x6e] = '\0';
      local_a8[0x6f] = '\0';
      local_a8[0x50] = '\0';
      local_a8[0x51] = '\0';
      local_a8[0x52] = '\0';
      local_a8[0x53] = '\0';
      local_a8[0x54] = '\0';
      local_a8[0x55] = '\0';
      local_a8[0x56] = '\0';
      local_a8[0x57] = '\0';
      local_a8[0x58] = '\0';
      local_a8[0x59] = '\0';
      local_a8[0x5a] = '\0';
      local_a8[0x5b] = '\0';
      local_a8[0x5c] = '\0';
      local_a8[0x5d] = '\0';
      local_a8[0x5e] = '\0';
      local_a8[0x5f] = '\0';
      local_a8[0x40] = '\0';
      local_a8[0x41] = '\0';
      local_a8[0x42] = '\0';
      local_a8[0x43] = '\0';
      local_a8[0x44] = '\0';
      local_a8[0x45] = '\0';
      local_a8[0x46] = '\0';
      local_a8[0x47] = '\0';
      local_a8[0x48] = '\0';
      local_a8[0x49] = '\0';
      local_a8[0x4a] = '\0';
      local_a8[0x4b] = '\0';
      local_a8[0x4c] = '\0';
      local_a8[0x4d] = '\0';
      local_a8[0x4e] = '\0';
      local_a8[0x4f] = '\0';
      local_a8[0x30] = '\0';
      local_a8[0x31] = '\0';
      local_a8[0x32] = '\0';
      local_a8[0x33] = '\0';
      local_a8[0x34] = '\0';
      local_a8[0x35] = '\0';
      local_a8[0x36] = '\0';
      local_a8[0x37] = '\0';
      local_a8[0x38] = '\0';
      local_a8[0x39] = '\0';
      local_a8[0x3a] = '\0';
      local_a8[0x3b] = '\0';
      local_a8[0x3c] = '\0';
      local_a8[0x3d] = '\0';
      local_a8[0x3e] = '\0';
      local_a8[0x3f] = '\0';
      local_a8[0x20] = '\0';
      local_a8[0x21] = '\0';
      local_a8[0x22] = '\0';
      local_a8[0x23] = '\0';
      local_a8[0x24] = '\0';
      local_a8[0x25] = '\0';
      local_a8[0x26] = '\0';
      local_a8[0x27] = '\0';
      local_a8[0x28] = '\0';
      local_a8[0x29] = '\0';
      local_a8[0x2a] = '\0';
      local_a8[0x2b] = '\0';
      local_a8[0x2c] = '\0';
      local_a8[0x2d] = '\0';
      local_a8[0x2e] = '\0';
      local_a8[0x2f] = '\0';
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      local_a8[0x14] = '\0';
      local_a8[0x15] = '\0';
      local_a8[0x16] = '\0';
      local_a8[0x17] = '\0';
      local_a8[0x18] = '\0';
      local_a8[0x19] = '\0';
      local_a8[0x1a] = '\0';
      local_a8[0x1b] = '\0';
      local_a8[0x1c] = '\0';
      local_a8[0x1d] = '\0';
      local_a8[0x1e] = '\0';
      local_a8[0x1f] = '\0';
      local_a8[0] = '\0';
      local_a8[1] = '\0';
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = '\0';
      local_a8[9] = '\0';
      local_a8[10] = '\0';
      local_a8[0xb] = '\0';
      local_a8[0xc] = '\0';
      local_a8[0xd] = '\0';
      local_a8[0xe] = '\0';
      local_a8[0xf] = '\0';
      local_a8[0x70] = '\0';
      local_a8[0x71] = '\0';
      local_a8[0x72] = '\0';
      local_a8[0x73] = '\0';
      local_a8[0x74] = '\0';
      local_a8[0x75] = '\0';
      local_a8[0x76] = '\0';
      local_a8[0x77] = '\0';
      pcVar1 = *(char **)((long)poVar5 + lVar3 * 4 + -0x24);
      if ((pcVar1 != (char *)0x0) && (*(int *)(poVar5->flags + lVar3 * 4 + -0x80) != 0)) {
        object_short_name(local_a8,0x78,pcVar1);
        pcVar1 = tval_find_name(*(wchar_t *)(poVar5->flags + lVar3 * 4 + -0x80));
        file_putf(fff,"object:%s:%s:%d:%d\n",pcVar1,local_a8,(ulong)kind_x_attr[uVar4],
                  (ulong)(uint)kind_x_char[uVar4]);
        paVar2 = z_info;
        poVar5 = k_info;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0xa8;
    } while (uVar4 < paVar2->k_max);
  }
  return;
}

Assistant:

void dump_objects(ang_file *fff)
{
	int i;

	file_putf(fff, "# Objects\n");

	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];
		char name[120] = "";

		if (!kind->name || !kind->tval) continue;

		object_short_name(name, sizeof name, kind->name);
		file_putf(fff, "object:%s:%s:%d:%d\n", tval_find_name(kind->tval),
				name, kind_x_attr[i], kind_x_char[i]);
	}
}